

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void mutex_stats_emit(emitter_t *emitter,emitter_row_t *row,emitter_col_t *col_uint64_t,
                     emitter_col_t *col_uint32_t)

{
  emitter_output_t eVar1;
  int iVar2;
  int iVar3;
  emitter_col_t *peVar4;
  char *pcVar5;
  char fmt [10];
  char local_3a [10];
  
  if (row != (emitter_row_t *)0x0) {
    eVar1 = emitter->output;
    if (eVar1 != emitter_output_table) goto LAB_0014104f;
    peVar4 = (row->cols).qlh_first;
    if (peVar4 != (emitter_col_t *)0x0) {
      do {
        emitter_print_value(emitter,peVar4->justify,peVar4->width,peVar4->type,&peVar4->field_3);
        peVar4 = (peVar4->link).qre_next;
        if (peVar4 == (emitter_col_t *)0x0) break;
      } while (peVar4 != (row->cols).qlh_first);
    }
    emitter_table_printf(emitter,"\n");
  }
  eVar1 = emitter->output;
LAB_0014104f:
  if (eVar1 == emitter_output_json) {
    if (emitter->emitted_key == true) {
      emitter->emitted_key = false;
    }
    else {
      pcVar5 = "";
      if (emitter->item_at_depth != false) {
        pcVar5 = ",";
      }
      emitter_printf(emitter,"%s\n",pcVar5);
      pcVar5 = "\t";
      if (emitter->output != emitter_output_json) {
        pcVar5 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar2 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        iVar3 = 1;
        if (1 < iVar2) {
          iVar3 = iVar2;
        }
        do {
          emitter_printf(emitter,"%s",pcVar5);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
    emitter_printf(emitter,"\"%s\": ","num_ops");
    emitter->emitted_key = true;
    if (emitter->output == emitter_output_json) {
      emitter->emitted_key = false;
      malloc_snprintf(local_3a,10,"%%%s","lu");
      emitter_printf(emitter,local_3a,(col_uint64_t->field_3).uint64_val);
      emitter->item_at_depth = true;
      if (emitter->output == emitter_output_json) {
        if (emitter->emitted_key == true) {
          emitter->emitted_key = false;
        }
        else {
          pcVar5 = "";
          if (emitter->item_at_depth != false) {
            pcVar5 = ",";
          }
          emitter_printf(emitter,"%s\n",pcVar5);
          pcVar5 = "\t";
          if (emitter->output != emitter_output_json) {
            pcVar5 = " ";
          }
          if (0 < emitter->nesting_depth) {
            iVar2 = emitter->nesting_depth << (emitter->output != emitter_output_json);
            iVar3 = 1;
            if (1 < iVar2) {
              iVar3 = iVar2;
            }
            do {
              emitter_printf(emitter,"%s",pcVar5);
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
        }
        emitter_printf(emitter,"\"%s\": ","num_wait");
        emitter->emitted_key = true;
        if (emitter->output == emitter_output_json) {
          emitter->emitted_key = false;
          malloc_snprintf(local_3a,10,"%%%s","lu");
          emitter_printf(emitter,local_3a,col_uint64_t[1].field_3.uint64_val);
          emitter->item_at_depth = true;
          if (emitter->output == emitter_output_json) {
            if (emitter->emitted_key == true) {
              emitter->emitted_key = false;
            }
            else {
              emitter_printf(emitter,"%s\n",",");
              pcVar5 = "\t";
              if (emitter->output != emitter_output_json) {
                pcVar5 = " ";
              }
              if (0 < emitter->nesting_depth) {
                iVar2 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                iVar3 = 1;
                if (1 < iVar2) {
                  iVar3 = iVar2;
                }
                do {
                  emitter_printf(emitter,"%s",pcVar5);
                  iVar3 = iVar3 + -1;
                } while (iVar3 != 0);
              }
            }
            emitter_printf(emitter,"\"%s\": ","num_spin_acq");
            emitter->emitted_key = true;
            if (emitter->output == emitter_output_json) {
              emitter->emitted_key = false;
              malloc_snprintf(local_3a,10,"%%%s","lu");
              emitter_printf(emitter,local_3a,col_uint64_t[2].field_3.uint64_val);
              emitter->item_at_depth = true;
              if (emitter->output == emitter_output_json) {
                if (emitter->emitted_key == true) {
                  emitter->emitted_key = false;
                }
                else {
                  emitter_printf(emitter,"%s\n",",");
                  pcVar5 = "\t";
                  if (emitter->output != emitter_output_json) {
                    pcVar5 = " ";
                  }
                  if (0 < emitter->nesting_depth) {
                    iVar2 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                    iVar3 = 1;
                    if (1 < iVar2) {
                      iVar3 = iVar2;
                    }
                    do {
                      emitter_printf(emitter,"%s",pcVar5);
                      iVar3 = iVar3 + -1;
                    } while (iVar3 != 0);
                  }
                }
                emitter_printf(emitter,"\"%s\": ","num_owner_switch");
                emitter->emitted_key = true;
                if (emitter->output == emitter_output_json) {
                  emitter->emitted_key = false;
                  malloc_snprintf(local_3a,10,"%%%s","lu");
                  emitter_printf(emitter,local_3a,col_uint64_t[3].field_3.uint64_val);
                  emitter->item_at_depth = true;
                  if (emitter->output == emitter_output_json) {
                    if (emitter->emitted_key == true) {
                      emitter->emitted_key = false;
                    }
                    else {
                      emitter_printf(emitter,"%s\n",",");
                      pcVar5 = "\t";
                      if (emitter->output != emitter_output_json) {
                        pcVar5 = " ";
                      }
                      if (0 < emitter->nesting_depth) {
                        iVar2 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                        iVar3 = 1;
                        if (1 < iVar2) {
                          iVar3 = iVar2;
                        }
                        do {
                          emitter_printf(emitter,"%s",pcVar5);
                          iVar3 = iVar3 + -1;
                        } while (iVar3 != 0);
                      }
                    }
                    emitter_printf(emitter,"\"%s\": ","total_wait_time");
                    emitter->emitted_key = true;
                    if (emitter->output == emitter_output_json) {
                      emitter->emitted_key = false;
                      malloc_snprintf(local_3a,10,"%%%s","lu");
                      emitter_printf(emitter,local_3a,col_uint64_t[4].field_3.uint64_val);
                      emitter->item_at_depth = true;
                      if (emitter->output == emitter_output_json) {
                        if (emitter->emitted_key == true) {
                          emitter->emitted_key = false;
                        }
                        else {
                          emitter_printf(emitter,"%s\n",",");
                          pcVar5 = "\t";
                          if (emitter->output != emitter_output_json) {
                            pcVar5 = " ";
                          }
                          if (0 < emitter->nesting_depth) {
                            iVar2 = emitter->nesting_depth <<
                                    (emitter->output != emitter_output_json);
                            iVar3 = 1;
                            if (1 < iVar2) {
                              iVar3 = iVar2;
                            }
                            do {
                              emitter_printf(emitter,"%s",pcVar5);
                              iVar3 = iVar3 + -1;
                            } while (iVar3 != 0);
                          }
                        }
                        emitter_printf(emitter,"\"%s\": ","max_wait_time");
                        emitter->emitted_key = true;
                        if (emitter->output == emitter_output_json) {
                          emitter->emitted_key = false;
                          malloc_snprintf(local_3a,10,"%%%s","lu");
                          emitter_printf(emitter,local_3a,col_uint64_t[5].field_3.uint64_val);
                          emitter->item_at_depth = true;
                          if (emitter->output == emitter_output_json) {
                            if (emitter->emitted_key == true) {
                              emitter->emitted_key = false;
                            }
                            else {
                              emitter_printf(emitter,"%s\n",",");
                              pcVar5 = "\t";
                              if (emitter->output != emitter_output_json) {
                                pcVar5 = " ";
                              }
                              if (0 < emitter->nesting_depth) {
                                iVar2 = emitter->nesting_depth <<
                                        (emitter->output != emitter_output_json);
                                iVar3 = 1;
                                if (1 < iVar2) {
                                  iVar3 = iVar2;
                                }
                                do {
                                  emitter_printf(emitter,"%s",pcVar5);
                                  iVar3 = iVar3 + -1;
                                } while (iVar3 != 0);
                              }
                            }
                            emitter_printf(emitter,"\"%s\": ","max_num_thds");
                            emitter->emitted_key = true;
                            if (emitter->output == emitter_output_json) {
                              emitter->emitted_key = false;
                              malloc_snprintf(local_3a,10,"%%%s","u");
                              emitter_printf(emitter,local_3a,
                                             (ulong)(col_uint32_t->field_3).unsigned_val);
                              emitter->item_at_depth = true;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
mutex_stats_emit(emitter_t *emitter, emitter_row_t *row,
    emitter_col_t col_uint64_t[mutex_prof_num_uint64_t_counters],
    emitter_col_t col_uint32_t[mutex_prof_num_uint32_t_counters]) {
	if (row != NULL) {
		emitter_table_row(emitter, row);
	}

	mutex_prof_uint64_t_counter_ind_t k_uint64_t = 0;
	mutex_prof_uint32_t_counter_ind_t k_uint32_t = 0;

	emitter_col_t *col;

#define EMITTER_TYPE_uint32_t emitter_type_uint32
#define EMITTER_TYPE_uint64_t emitter_type_uint64
#define OP(counter, type, human, derived, base_counter)		\
	if (!derived) {                    \
		col = &col_##type[k_##type];                        \
		++k_##type;                            \
		emitter_json_kv(emitter, #counter, EMITTER_TYPE_##type,        \
		    (const void *)&col->bool_val); \
	}
	MUTEX_PROF_COUNTERS;
#undef OP
#undef EMITTER_TYPE_uint32_t
#undef EMITTER_TYPE_uint64_t
}